

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fchown_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req->fs_type == UV_FS_FCHOWN) {
    if (req->result == 0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
    pcVar2 = "req->result == 0";
    uVar1 = 0x112;
  }
  else {
    pcVar2 = "req->fs_type == UV_FS_FCHOWN";
    uVar1 = 0x111;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar1,pcVar2);
  abort();
}

Assistant:

static void fchown_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_FCHOWN);
  ASSERT(req->result == 0);
  fchown_cb_count++;
  uv_fs_req_cleanup(req);
}